

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS
ref_phys_strong_sensor_bc
          (REF_GRID ref_grid,REF_DBL *scalar,REF_DBL strong_value,REF_DICT ref_dict_bcs)

{
  REF_STATUS RVar1;
  REF_BOOL RVar2;
  uint uVar3;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_INT cell_node_1;
  REF_INT nodes_1 [27];
  int local_d0;
  REF_INT local_cc;
  REF_INT cell_1;
  REF_INT bc_1;
  REF_CELL ref_cell_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_INT cell_node;
  REF_INT nodes [27];
  int local_40;
  REF_INT local_3c;
  REF_INT cell;
  REF_INT bc;
  REF_CELL ref_cell;
  REF_DICT ref_dict_bcs_local;
  REF_DBL strong_value_local;
  REF_DBL *scalar_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_dict_bcs;
  ref_dict_bcs_local = (REF_DICT)strong_value;
  strong_value_local = (REF_DBL)scalar;
  scalar_local = (REF_DBL *)ref_grid;
  if (ref_grid->twod == 0) {
    _cell_1 = ref_grid->cell[3];
    for (local_d0 = 0; local_d0 < _cell_1->max; local_d0 = local_d0 + 1) {
      RVar1 = ref_cell_nodes(_cell_1,local_d0,&ref_private_macro_code_rxs_1);
      if (RVar1 == 0) {
        local_cc = -1;
        uVar3 = ref_dict_value((REF_DICT)ref_cell,(&ref_private_macro_code_rxs_1)[_cell_1->node_per]
                               ,&local_cc);
        if ((uVar3 != 0) && (uVar3 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x547,"ref_phys_strong_sensor_bc",(ulong)uVar3,"bc");
          return uVar3;
        }
        RVar2 = ref_phys_wall_distance_bc(local_cc);
        if (RVar2 != 0) {
          for (ref_private_macro_code_rxs_2 = 0; ref_private_macro_code_rxs_2 < _cell_1->node_per;
              ref_private_macro_code_rxs_2 = ref_private_macro_code_rxs_2 + 1) {
            *(REF_DICT *)
             ((long)strong_value_local +
             (long)(&ref_private_macro_code_rxs_1)[ref_private_macro_code_rxs_2] * 8) =
                 ref_dict_bcs_local;
          }
        }
      }
    }
    _cell_1 = (REF_CELL)scalar_local[8];
    for (local_d0 = 0; local_d0 < _cell_1->max; local_d0 = local_d0 + 1) {
      RVar1 = ref_cell_nodes(_cell_1,local_d0,&ref_private_macro_code_rxs_1);
      if (RVar1 == 0) {
        local_cc = -1;
        uVar3 = ref_dict_value((REF_DICT)ref_cell,(&ref_private_macro_code_rxs_1)[_cell_1->node_per]
                               ,&local_cc);
        if ((uVar3 != 0) && (uVar3 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x552,"ref_phys_strong_sensor_bc",(ulong)uVar3,"bc");
          return uVar3;
        }
        RVar2 = ref_phys_wall_distance_bc(local_cc);
        if (RVar2 != 0) {
          for (ref_private_macro_code_rxs_2 = 0; ref_private_macro_code_rxs_2 < _cell_1->node_per;
              ref_private_macro_code_rxs_2 = ref_private_macro_code_rxs_2 + 1) {
            *(REF_DICT *)
             ((long)strong_value_local +
             (long)(&ref_private_macro_code_rxs_1)[ref_private_macro_code_rxs_2] * 8) =
                 ref_dict_bcs_local;
          }
        }
      }
    }
  }
  else {
    _cell = ref_grid->cell[0];
    for (local_40 = 0; local_40 < _cell->max; local_40 = local_40 + 1) {
      RVar1 = ref_cell_nodes(_cell,local_40,&ref_private_macro_code_rxs);
      if (RVar1 == 0) {
        local_3c = -1;
        ref_cell_1._0_4_ =
             ref_dict_value((REF_DICT)ref_cell,(&ref_private_macro_code_rxs)[_cell->node_per],
                            &local_3c);
        if (((uint)ref_cell_1 != 0) && ((uint)ref_cell_1 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x538,"ref_phys_strong_sensor_bc",(ulong)(uint)ref_cell_1,"bc");
          return (uint)ref_cell_1;
        }
        RVar2 = ref_phys_wall_distance_bc(local_3c);
        if (RVar2 != 0) {
          for (ref_cell_1._4_4_ = 0; ref_cell_1._4_4_ < _cell->node_per;
              ref_cell_1._4_4_ = ref_cell_1._4_4_ + 1) {
            *(REF_DICT *)
             ((long)strong_value_local + (long)(&ref_private_macro_code_rxs)[ref_cell_1._4_4_] * 8)
                 = ref_dict_bcs_local;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_strong_sensor_bc(REF_GRID ref_grid, REF_DBL *scalar,
                                             REF_DBL strong_value,
                                             REF_DICT ref_dict_bcs) {
  if (ref_grid_twod(ref_grid)) {
    REF_CELL ref_cell;
    REF_INT bc;
    REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
    ref_cell = ref_grid_edg(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[nodes[cell_node]] = strong_value;
        }
      }
    }
  } else {
    REF_CELL ref_cell;
    REF_INT bc;
    REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[nodes[cell_node]] = strong_value;
        }
      }
    }
    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[nodes[cell_node]] = strong_value;
        }
      }
    }
  }
  return REF_SUCCESS;
}